

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O2

Http * __thiscall arbiter::Endpoint::getHttpDriver(Endpoint *this)

{
  Http *pHVar1;
  ArbiterError *this_00;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pHVar1 = tryGetHttpDriver(this);
  if (pHVar1 != (Http *)0x0) {
    return pHVar1;
  }
  this_00 = (ArbiterError *)__cxa_allocate_exception(0x10);
  profiledProtocol_abi_cxx11_(&sStack_78,this);
  ::std::operator+(&local_58,"Cannot get driver of type ",&sStack_78);
  ::std::operator+(&local_38,&local_58," as HTTP");
  ArbiterError::ArbiterError(this_00,&local_38);
  __cxa_throw(this_00,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const drivers::Http& Endpoint::getHttpDriver() const
{
    if (auto d = tryGetHttpDriver()) return *d;
    else throw ArbiterError(
        "Cannot get driver of type " + profiledProtocol() + " as HTTP");
}